

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_ic.c
# Opt level: O0

int IDASensNewtonIC(IDAMem IDA_mem)

{
  int iVar1;
  long in_RDI;
  sunrealtype sVar2;
  sunrealtype rate;
  sunrealtype oldfnrm;
  sunrealtype fnorm0;
  sunrealtype fnorm;
  sunrealtype delnorm;
  int mnewt;
  int is;
  int retval;
  undefined8 in_stack_ffffffffffffffb8;
  double dVar3;
  N_Vector *in_stack_ffffffffffffffc0;
  double dVar4;
  N_Vector *in_stack_ffffffffffffffc8;
  IDAMem in_stack_ffffffffffffffd0;
  double dVar5;
  int local_1c;
  int local_18;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  for (local_18 = 0; local_18 < *(int *)(in_RDI + 0xa0); local_18 = local_18 + 1) {
    iVar1 = (**(code **)(in_RDI + 0x748))
                      (in_RDI,*(undefined8 *)(*(long *)(in_RDI + 0x3b0) + (long)local_18 * 8),
                       *(undefined8 *)(*(long *)(in_RDI + 0x380) + (long)local_18 * 8),
                       *(undefined8 *)(in_RDI + 0x460),*(undefined8 *)(in_RDI + 0x468),
                       *(undefined8 *)(in_RDI + 0x2a0));
    if (iVar1 < 0) {
      return -7;
    }
    if (0 < iVar1) {
      return 1;
    }
  }
  sVar2 = IDASensWrmsNorm(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                          in_stack_ffffffffffffffc0,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20))
  ;
  if (*(int *)(in_RDI + 0x488) == 0) {
    sVar2 = *(double *)(in_RDI + 0x4a0) * ABS(*(double *)(in_RDI + 0x508)) * sVar2;
  }
  if (*(double *)(in_RDI + 0x538) < sVar2) {
    dVar3 = 0.0;
    dVar4 = sVar2;
    for (local_1c = 0; local_1c < *(int *)(in_RDI + 0x480); local_1c = local_1c + 1) {
      *(long *)(in_RDI + 0x630) = *(long *)(in_RDI + 0x630) + 1;
      dVar5 = dVar4;
      iVar1 = IDASensLineSrch((IDAMem)oldfnrm,(sunrealtype *)rate,
                              (sunrealtype *)
                              CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
      if (iVar1 != 0) {
        return iVar1;
      }
      dVar3 = dVar5 / dVar4;
      if (dVar5 <= *(double *)(in_RDI + 0x538)) {
        return 0;
      }
      for (local_18 = 0; local_18 < *(int *)(in_RDI + 0xa0); local_18 = local_18 + 1) {
        N_VScale(0x3ff0000000000000,*(undefined8 *)(*(long *)(in_RDI + 0x3d8) + (long)local_18 * 8),
                 *(undefined8 *)(*(long *)(in_RDI + 0x3b0) + (long)local_18 * 8));
      }
      dVar4 = dVar5;
    }
    if ((dVar3 <= 0.9) || (dVar4 < sVar2 * 0.1)) {
      iVar1 = 5;
    }
    else {
      iVar1 = 4;
    }
  }
  else {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int IDASensNewtonIC(IDAMem IDA_mem)
{
  int retval, is, mnewt;
  sunrealtype delnorm, fnorm, fnorm0, oldfnrm, rate;

  for (is = 0; is < IDA_mem->ida_Ns; is++)
  {
    /* Call the linear solve function to get the Newton step, delta. */
    retval = IDA_mem->ida_lsolve(IDA_mem, IDA_mem->ida_deltaS[is],
                                 IDA_mem->ida_ewtS[is], IDA_mem->ida_yy0,
                                 IDA_mem->ida_yp0, IDA_mem->ida_delta);
    if (retval < 0) { return (IDA_LSOLVE_FAIL); }
    if (retval > 0) { return (IC_FAIL_RECOV); }
  }
  /* Compute the norm of the step and return if it is small enough */
  fnorm = IDASensWrmsNorm(IDA_mem, IDA_mem->ida_deltaS, IDA_mem->ida_ewtS,
                          SUNFALSE);
  if (IDA_mem->ida_sysindex == 0)
  {
    fnorm *= IDA_mem->ida_tscale * SUNRabs(IDA_mem->ida_cj);
  }
  if (fnorm <= IDA_mem->ida_epsNewt) { return (IDA_SUCCESS); }
  fnorm0 = fnorm;

  rate = ZERO;

  /* Newton iteration loop */
  for (mnewt = 0; mnewt < IDA_mem->ida_maxnit; mnewt++)
  {
    IDA_mem->ida_nniS++;
    delnorm = fnorm;
    oldfnrm = fnorm;

    /* Call the Linesearch function and return if it failed. */
    retval = IDASensLineSrch(IDA_mem, &delnorm, &fnorm);
    if (retval != IDA_SUCCESS) { return (retval); }

    /* Set the observed convergence rate and test for convergence. */
    rate = fnorm / oldfnrm;
    if (fnorm <= IDA_mem->ida_epsNewt) { return (IDA_SUCCESS); }

    /* If not converged, copy new step vectors, and loop. */
    for (is = 0; is < IDA_mem->ida_Ns; is++)
    {
      N_VScale(ONE, IDA_mem->ida_delnewS[is], IDA_mem->ida_deltaS[is]);
    }

  } /* End of Newton iteration loop */

  /* Return either IC_SLOW_CONVRG or recoverable fail flag. */
  if (rate <= ICRATEMAX || fnorm < PT1 * fnorm0) { return (IC_SLOW_CONVRG); }
  return (IC_CONV_FAIL);
}